

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * contextMalloc(sqlite3_context *context,i64 nByte)

{
  sqlite3 *psVar1;
  sqlite3 *db;
  char *z;
  i64 nByte_local;
  sqlite3_context *context_local;
  
  psVar1 = sqlite3_context_db_handle(context);
  if (psVar1->aLimit[0] < nByte) {
    sqlite3_result_error_toobig(context);
    db = (sqlite3 *)0x0;
  }
  else {
    db = (sqlite3 *)sqlite3Malloc(nByte);
    if (db == (sqlite3 *)0x0) {
      sqlite3_result_error_nomem(context);
    }
  }
  return db;
}

Assistant:

static void *contextMalloc(sqlite3_context *context, i64 nByte){
  char *z;
  sqlite3 *db = sqlite3_context_db_handle(context);
  assert( nByte>0 );
  testcase( nByte==db->aLimit[SQLITE_LIMIT_LENGTH] );
  testcase( nByte==db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  if( nByte>db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
    z = 0;
  }else{
    z = sqlite3Malloc(nByte);
    if( !z ){
      sqlite3_result_error_nomem(context);
    }
  }
  return z;
}